

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O3

wchar_t archive_string_append_unicode
                  (archive_string *as,void *_p,size_t len,archive_string_conv *sc)

{
  wchar_t wVar1;
  size_t sVar2;
  uint uVar3;
  archive_string *paVar4;
  long lVar5;
  code *pcVar6;
  char *pcVar7;
  code *pcVar8;
  char *pcVar9;
  long lVar10;
  uint uVar11;
  undefined8 unaff_R14;
  ulong uVar12;
  long lVar13;
  uint32_t uc;
  undefined4 local_74;
  code *local_70;
  void *local_68;
  wchar_t local_5c;
  long local_58;
  ulong local_50;
  size_t local_48;
  long local_40;
  code *local_38;
  
  wVar1 = sc->flag;
  local_70 = unicode_to_utf16be;
  lVar13 = 2;
  uVar12 = CONCAT71((int7)((ulong)unaff_R14 >> 8),1);
  if (((uint)wVar1 >> 10 & 1) == 0) {
    if (((uint)wVar1 >> 0xc & 1) == 0) {
      if (((uint)wVar1 >> 8 & 1) == 0) {
        if (((uint)wVar1 >> 0xb & 1) == 0) {
          uVar11 = (uint)wVar1 >> 0xd & 1;
          uVar12 = (ulong)uVar11;
          lVar13 = uVar12 + 1;
          local_70 = unicode_to_utf8;
          if (uVar11 != 0) {
            local_70 = unicode_to_utf16le;
          }
        }
      }
      else {
        local_70 = unicode_to_utf8;
        lVar13 = 1;
        uVar12 = 0;
      }
    }
    else {
      local_70 = unicode_to_utf16le;
    }
  }
  pcVar6 = utf16le_to_unicode;
  if (((uint)wVar1 >> 0xd & 1) == 0) {
    pcVar6 = cesu8_to_unicode;
  }
  local_40 = 1;
  if ((wVar1 & 0x2800U) == 0) {
    local_40 = lVar13;
  }
  pcVar8 = utf16be_to_unicode;
  if (((uint)wVar1 >> 0xb & 1) == 0) {
    pcVar8 = pcVar6;
  }
  local_68 = _p;
  paVar4 = archive_string_ensure(as,local_40 * len + lVar13 + as->length);
  if (paVar4 == (archive_string *)0x0) {
LAB_004aa146:
    local_5c = L'\xffffffff';
  }
  else {
    pcVar7 = as->s;
    sVar2 = as->buffer_length;
    pcVar9 = pcVar7 + as->length;
    local_58 = lVar13;
    local_50 = uVar12;
    local_38 = pcVar8;
    uVar11 = (*pcVar8)(&local_74,local_68,len);
    if (uVar11 == 0) {
      local_5c = L'\0';
    }
    else {
      lVar13 = -local_58;
      pcVar7 = pcVar7 + lVar13 + sVar2;
      local_5c = L'\0';
      do {
        uVar3 = -uVar11;
        if (0 < (int)uVar11) {
          uVar3 = uVar11;
        }
        if ((int)uVar11 < 0) {
          local_5c = L'\xffffffff';
        }
        len = len - uVar3;
        lVar5 = (*local_70)(pcVar9,(long)pcVar7 - (long)pcVar9,local_74);
        if (lVar5 == 0) {
          lVar10 = len * local_40 + local_58;
          local_48 = len;
          do {
            as->length = (long)pcVar9 - (long)as->s;
            paVar4 = archive_string_ensure(as,as->buffer_length + lVar10);
            if (paVar4 == (archive_string *)0x0) goto LAB_004aa146;
            pcVar9 = as->s + as->length;
            pcVar7 = as->s + lVar13 + as->buffer_length;
            lVar5 = (*local_70)(pcVar9,(long)pcVar7 - (long)pcVar9,local_74);
            len = local_48;
          } while (lVar5 == 0);
        }
        pcVar9 = pcVar9 + lVar5;
        local_68 = (void *)((long)local_68 + (ulong)uVar3);
        uVar11 = (*local_38)(&local_74,local_68,len);
      } while (uVar11 != 0);
    }
    as->length = (long)pcVar9 - (long)as->s;
    *pcVar9 = '\0';
    if ((char)local_50 != '\0') {
      as->s[as->length + 1] = '\0';
    }
  }
  return local_5c;
}

Assistant:

static int
archive_string_append_unicode(struct archive_string *as, const void *_p,
    size_t len, struct archive_string_conv *sc)
{
	const char *s;
	char *p, *endp;
	uint32_t uc;
	size_t w;
	int n, ret = 0, ts, tm;
	int (*parse)(uint32_t *, const char *, size_t);
	size_t (*unparse)(char *, size_t, uint32_t);

	if (sc->flag & SCONV_TO_UTF16BE) {
		unparse = unicode_to_utf16be;
		ts = 2;
	} else if (sc->flag & SCONV_TO_UTF16LE) {
		unparse = unicode_to_utf16le;
		ts = 2;
	} else if (sc->flag & SCONV_TO_UTF8) {
		unparse = unicode_to_utf8;
		ts = 1;
	} else {
		/*
		 * This case is going to be converted to another
		 * character-set through iconv.
		 */
		if (sc->flag & SCONV_FROM_UTF16BE) {
			unparse = unicode_to_utf16be;
			ts = 2;
		} else if (sc->flag & SCONV_FROM_UTF16LE) {
			unparse = unicode_to_utf16le;
			ts = 2;
		} else {
			unparse = unicode_to_utf8;
			ts = 1;
		}
	}

	if (sc->flag & SCONV_FROM_UTF16BE) {
		parse = utf16be_to_unicode;
		tm = 1;
	} else if (sc->flag & SCONV_FROM_UTF16LE) {
		parse = utf16le_to_unicode;
		tm = 1;
	} else {
		parse = cesu8_to_unicode;
		tm = ts;
	}

	if (archive_string_ensure(as, as->length + len * tm + ts) == NULL)
		return (-1);

	s = (const char *)_p;
	p = as->s + as->length;
	endp = as->s + as->buffer_length - ts;
	while ((n = parse(&uc, s, len)) != 0) {
		if (n < 0) {
			/* Use a replaced unicode character. */
			n *= -1;
			ret = -1;
		}
		s += n;
		len -= n;
		while ((w = unparse(p, endp - p, uc)) == 0) {
			/* There is not enough output buffer so
			 * we have to expand it. */
			as->length = p - as->s;
			if (archive_string_ensure(as,
			    as->buffer_length + len * tm + ts) == NULL)
				return (-1);
			p = as->s + as->length;
			endp = as->s + as->buffer_length - ts;
		}
		p += w;
	}
	as->length = p - as->s;
	as->s[as->length] = '\0';
	if (ts == 2)
		as->s[as->length+1] = '\0';
	return (ret);
}